

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

bool __thiscall OpenMD::ZConstraintForceModifier::haveMovingZMols(ZConstraintForceModifier *this)

{
  bool bVar1;
  long in_RDI;
  int haveMoving;
  
  bVar1 = std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::empty
                    ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                     (in_RDI + 0x10));
  return !bVar1;
}

Assistant:

bool ZConstraintForceModifier::haveMovingZMols() {
    int haveMoving = movingZMols_.empty() ? 0 : 1;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &haveMoving, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    return haveMoving > 0;
  }